

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.h
# Opt level: O0

void __thiscall
HighsGFkSolve::fromCSC<2u,1,long>
          (HighsGFkSolve *this,vector<long,_std::allocator<long>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart,
          HighsInt numRow)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  vector<long,_std::allocator<long>_> *in_RSI;
  HighsGFkSolve *in_RDI;
  HighsInt in_R8D;
  HighsInt pos;
  HighsInt nnz;
  int64_t val;
  HighsInt j;
  HighsInt i;
  priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>
  *in_stack_ffffffffffffff48;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<int,_std::allocator<int>_> *__new_size;
  size_type in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *__n;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  int local_64;
  int local_60;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x64ff95);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x64ffa3);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x64ffb1);
  std::priority_queue<int,std::vector<int,std::allocator<int>>,std::greater<int>>::
  priority_queue<std::vector<int,std::allocator<int>>,void>
            ((priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_> *)
             in_stack_ffffffffffffff50);
  std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::operator=
            ((priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::
  ~priority_queue((priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_> *
                  )0x64ffdb);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)&in_RDI->numCol)->_M_impl).
           super__Vector_impl_data._M_start = (int)sVar1 + -1;
  in_RDI->numRow = in_R8D;
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48,
             (value_type_conflict2 *)0x65001f);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48,
             (value_type_conflict2 *)0x650040);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff50,
             (size_type)in_stack_ffffffffffffff48,(value_type_conflict3 *)0x65006b);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48,
             (value_type_conflict2 *)0x650091);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48,
             (value_type_conflict2 *)0x6500b4);
  this_00 = &in_RDI->Avalue;
  std::vector<long,_std::allocator<long>_>::size(in_RSI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  __new_size = &in_RDI->Acol;
  std::vector<long,_std::allocator<long>_>::size(in_RSI);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  __n = &in_RDI->Arow;
  std::vector<long,_std::allocator<long>_>::size(in_RSI);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(size_type)__n);
  for (local_60 = 0;
      local_60 !=
      *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)&in_RDI->numCol)->_M_impl).
               super__Vector_impl_data._M_start; local_60 = local_60 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_60);
    local_64 = *pvVar2;
    while (iVar4 = local_64,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)(local_60 + 1)),
          iVar4 != *pvVar2) {
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](in_RSI,(long)local_64);
      if (*pvVar3 % 2 != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff50,
                   (value_type_conflict3 *)in_stack_ffffffffffffff48);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)this_00,
                   (value_type_conflict2 *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff50 = &in_RDI->Arow;
        std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_64);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)this_00,
                   (value_type_conflict2 *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
      }
      local_64 = local_64 + 1;
    }
  }
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->Avalue);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
  __to = extraout_RDX;
  for (uVar5 = 0; uVar5 != (uint)sVar1; uVar5 = uVar5 + 1) {
    link(in_RDI,(char *)(ulong)uVar5,__to);
    __to = extraout_RDX_00;
  }
  return;
}

Assistant:

void fromCSC(const std::vector<T>& Aval, const std::vector<HighsInt>& Aindex,
               const std::vector<HighsInt>& Astart, HighsInt numRow) {
    Avalue.clear();
    Acol.clear();
    Arow.clear();

    freeslots = decltype(freeslots)();

    numCol = Astart.size() - 1;
    this->numRow = numRow;

    colhead.assign(numCol, -1);
    colsize.assign(numCol, 0);

    rhs.assign(kNumRhs * numRow, 0);
    rowroot.assign(numRow, -1);
    rowsize.assign(numRow, 0);

    Avalue.reserve(Aval.size());
    Acol.reserve(Aval.size());
    Arow.reserve(Aval.size());

    for (HighsInt i = 0; i != numCol; ++i) {
      for (HighsInt j = Astart[i]; j != Astart[i + 1]; ++j) {
        assert(Aval[j] == (int64_t)Aval[j]);
        int64_t val = ((int64_t)Aval[j]) % k;
        if (val == 0) continue;

        if (val < 0) val += k;
        assert(val >= 0);

        Avalue.push_back(val);
        Acol.push_back(i);
        Arow.push_back(Aindex[j]);
      }
    }

    HighsInt nnz = Avalue.size();
    Anext.resize(nnz);
    Aprev.resize(nnz);
    ARleft.resize(nnz);
    ARright.resize(nnz);
    for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);
  }